

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

RegOpnd * __thiscall
Lowerer::GenerateCachedTypeCheck
          (Lowerer *this,Instr *instrChk,PropertySymOpnd *propertySymOpnd,
          LabelInstr *labelObjCheckFailed,LabelInstr *labelTypeCheckFailed,
          LabelInstr *labelSecondChance)

{
  Func *func_00;
  code *pcVar1;
  undefined8 baseOpnd_00;
  JITTypeHolderBase<void> type;
  JITTypeHolder JVar2;
  bool bVar3;
  BYTE BVar4;
  ValueType valueType;
  uint32 uVar5;
  int32 offset;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  RegOpnd *typeOpnd_00;
  void *pvVar11;
  PropertySymOpnd *pPVar12;
  JITType *this_00;
  intptr_t address;
  size_t sVar13;
  RegOpnd *pRVar14;
  JitPolyEquivalentTypeGuard *this_01;
  intptr_t *piVar15;
  AddrOpnd *src;
  JITTimeFunctionBody *pJVar16;
  char16 *pcVar17;
  JITTimeWorkItem *this_02;
  FunctionJITTimeInfo *this_03;
  BVSparse<Memory::JitArenaAllocator> *pBVar18;
  Func *pFVar19;
  StackSym *pSVar20;
  PropertySym *pPVar21;
  LabelInstr *local_5d8;
  char16_t *local_5b8;
  bool local_54a;
  bool local_549;
  bool local_539;
  nullptr_t local_510;
  BranchInstr *local_508;
  BranchInstr *branchInstr_1;
  Instr *equivalentTypeCheckCallInstr;
  HelperCallOpnd *equivalentTypeCheckHelperCallOpnd;
  RegOpnd *equivalentTypeCheckResultOpnd;
  AddrOpnd *pAStack_4e0;
  JnHelperMethod helperMethod;
  Opnd *typeCheckGuardOpnd;
  LabelInstr *labelTypeCheckSucceeded;
  BranchInstr *branchInstr;
  LabelInstr *labelCheckEquivalentType;
  WCHAR local_4b8 [4];
  WCHAR prefixValue [512];
  RegOpnd *baseOpnd_1;
  RegOpnd *baseOpnd;
  JITTypeHolderBase<void> local_a0;
  JITTypeHolder directCheckType;
  Opnd *expectedTypeOpnd;
  JITTypeHolder local_88;
  JITTypeHolderBase<void> local_80;
  JITTypeHolder monoType;
  RegOpnd *polyIndexOpnd;
  PropertyGuard *typeCheckGuard;
  IndirOpnd *pIStack_60;
  bool doEquivTypeCheck;
  Opnd *sourceType;
  RegOpnd *typeOpnd;
  RegOpnd *regOpnd;
  Func *func;
  LabelInstr *labelSecondChance_local;
  LabelInstr *labelTypeCheckFailed_local;
  LabelInstr *labelObjCheckFailed_local;
  PropertySymOpnd *propertySymOpnd_local;
  Instr *instrChk_local;
  Lowerer *this_local;
  
  bVar3 = IR::PropertySymOpnd::MayNeedTypeCheckProtection(propertySymOpnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1d96,"(propertySymOpnd->MayNeedTypeCheckProtection())",
                       "propertySymOpnd->MayNeedTypeCheckProtection()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  func_00 = instrChk->m_func;
  pRVar10 = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,func_00);
  valueType = IR::SymOpnd::GetPropertyOwnerValueType(&propertySymOpnd->super_SymOpnd);
  IR::Opnd::SetValueType(&pRVar10->super_Opnd,valueType);
  bVar3 = IR::Opnd::IsNotTaggedValue(&pRVar10->super_Opnd);
  if (!bVar3) {
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,&pRVar10->super_Opnd,instrChk,labelObjCheckFailed,false);
  }
  typeOpnd_00 = IR::RegOpnd::New(TyInt64,func_00);
  bVar3 = StackSym::IsConst(pRVar10->m_sym);
  if (((!bVar3) || (bVar3 = StackSym::IsIntConst(pRVar10->m_sym), bVar3)) ||
     (bVar3 = StackSym::IsFloatConst(pRVar10->m_sym), bVar3)) {
    uVar5 = Js::RecyclableObject::GetOffsetOfType();
    pIStack_60 = IR::IndirOpnd::New(pRVar10,uVar5,TyInt64,func_00,false);
  }
  else {
    pvVar11 = StackSym::GetConstAddress(pRVar10->m_sym,false);
    uVar5 = Js::RecyclableObject::GetOffsetOfType();
    pIStack_60 = (IndirOpnd *)
                 IR::MemRefOpnd::New((void *)((long)pvVar11 + (ulong)uVar5),TyInt64,func_00,
                                     AddrOpndKindDynamicObjectTypeRef);
  }
  InsertMove(&typeOpnd_00->super_Opnd,&pIStack_60->super_Opnd,instrChk,true);
  bVar3 = IR::Instr::HasEquivalentTypeCheckBailOut(instrChk);
  if (bVar3) {
    bVar3 = IR::PropertySymOpnd::TypeCheckRequired(propertySymOpnd);
    local_539 = true;
    if (bVar3) goto LAB_007be486;
    pPVar12 = (PropertySymOpnd *)IR::Instr::GetDst(instrChk);
    local_539 = true;
    if (propertySymOpnd == pPVar12) goto LAB_007be486;
  }
  bVar3 = IR::PropertySymOpnd::HasEquivalentTypeSet(propertySymOpnd);
  local_549 = false;
  if (bVar3) {
    bVar3 = IR::PropertySymOpnd::HasFinalType(propertySymOpnd);
    if (bVar3) {
      bVar3 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd);
      local_549 = false;
      if (bVar3) goto LAB_007be47a;
    }
    bVar3 = IR::PropertySymOpnd::MustDoMonoCheck(propertySymOpnd);
    local_549 = false;
    if (!bVar3) {
      bVar3 = IR::PropertySymOpnd::IsPoly(propertySymOpnd);
      local_54a = true;
      if (!bVar3) {
        local_54a = IR::Instr::HasTypeCheckBailOut(instrChk);
      }
      local_549 = local_54a;
    }
  }
LAB_007be47a:
  local_539 = local_549;
LAB_007be486:
  if ((local_539 == false) && (bVar3 = IR::Instr::HasEquivalentTypeCheckBailOut(instrChk), bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1db8,"(doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut())",
                       "doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  monoType.t = (Type)0x0;
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_80,(JITType *)0x0);
  if (local_539 == false) {
    bVar3 = IR::PropertySymOpnd::MustDoMonoCheck(propertySymOpnd);
    if (bVar3) {
      local_88 = IR::PropertySymOpnd::GetMonoGuardType(propertySymOpnd);
    }
    else {
      local_88 = IR::PropertySymOpnd::GetType(propertySymOpnd);
    }
    local_80.t = local_88.t;
    polyIndexOpnd =
         (RegOpnd *)CreateTypePropertyGuardForGuardedProperties(this,local_88,propertySymOpnd);
  }
  else {
    polyIndexOpnd =
         (RegOpnd *)CreateEquivalentTypeGuardAndLinkToGuardedProperties(this,propertySymOpnd);
    bVar3 = Js::PropertyGuard::IsPoly((PropertyGuard *)polyIndexOpnd);
    if (bVar3) {
      bVar3 = IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard(propertySymOpnd,this->m_func);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1dc4,"(propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func))",
                           "propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      monoType.t = (Type)GeneratePolymorphicTypeIndex
                                   (this,typeOpnd_00,(PropertyGuard *)polyIndexOpnd,instrChk);
    }
  }
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_a0,(JITType *)0x0);
  if (polyIndexOpnd == (RegOpnd *)0x0) {
    baseOpnd = (RegOpnd *)0x0;
    bVar3 = JITTypeHolderBase<void>::operator!=(&local_80,&baseOpnd);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1dd3,"(monoType != nullptr)","monoType != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    this_00 = JITTypeHolderBase<void>::operator->(&local_80);
    address = JITType::GetAddr(this_00);
    directCheckType.t =
         (Type)IR::AddrOpnd::New(address,AddrOpndKindDynamicType,func_00,true,(Var)0x0);
    local_a0.t = local_80.t;
  }
  else {
    sVar13 = Js::PropertyGuard::GetSizeOfValue();
    if (sVar13 != 8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1dd9,
                         "(Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr]))"
                         ,
                         "Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr])"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar3 = Func::IsOOPJIT(this->m_func);
    if (bVar3) {
      if (monoType.t == (Type)0x0) {
        directCheckType.t = (Type)GenerateIndirOfOOPData(this,polyIndexOpnd,0,instrChk);
      }
      else {
        pRVar14 = IR::RegOpnd::New(TyUint64,func_00);
        offset = Js::JitPolyEquivalentTypeGuard::GetOffsetOfPolyValues();
        GenerateLeaOfOOPData(this,pRVar14,polyIndexOpnd,offset,instrChk);
        JVar2 = monoType;
        BVar4 = LowererMD::GetDefaultIndirScale();
        directCheckType.t =
             (Type)IR::IndirOpnd::New(pRVar14,(RegOpnd *)JVar2.t,BVar4,TyUint64,func_00);
      }
      pBVar18 = this->addToLiveOnBackEdgeSyms;
      pFVar19 = Func::GetTopFunc(func_00);
      pSVar20 = Func::GetNativeCodeDataSym(pFVar19);
      BVSparse<Memory::JitArenaAllocator>::Set(pBVar18,(pSVar20->super_Sym).m_id);
    }
    else if (monoType.t == (Type)0x0) {
      piVar15 = Js::PropertyGuard::GetAddressOfValue((PropertyGuard *)polyIndexOpnd);
      directCheckType.t =
           (Type)IR::MemRefOpnd::New(piVar15,TyUint64,func_00,AddrOpndKindDynamicGuardValueRef);
    }
    else {
      pRVar14 = IR::RegOpnd::New(TyUint64,func_00);
      prefixValue._1016_8_ = pRVar14;
      this_01 = Js::PropertyGuard::AsPolyTypeCheckGuard((PropertyGuard *)polyIndexOpnd);
      piVar15 = Js::JitPolyEquivalentTypeGuard::GetAddressOfPolyValues(this_01);
      src = IR::AddrOpnd::New(piVar15,AddrOpndKindDynamicTypeCheckGuard,func_00,true,(Var)0x0);
      InsertMove(&pRVar14->super_Opnd,&src->super_Opnd,instrChk,true);
      JVar2 = monoType;
      baseOpnd_00 = prefixValue._1016_8_;
      BVar4 = LowererMD::GetDefaultIndirScale();
      directCheckType.t =
           (Type)IR::IndirOpnd::New((RegOpnd *)baseOpnd_00,(RegOpnd *)JVar2.t,BVar4,TyUint64,func_00
                                   );
    }
  }
  uVar6 = Func::GetSourceContextId(this->m_func);
  uVar7 = Func::GetLocalFunctionId(this->m_func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar6,uVar7);
  if ((bVar3) && ((DAT_01ec73ca & 1) != 0)) {
    if ((DAT_01ec73ca & 1) != 0) {
      uVar6 = Func::GetSourceContextId(this->m_func);
      uVar7 = Func::GetLocalFunctionId(this->m_func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar6,uVar7);
      if (bVar3) {
        pJVar16 = Func::GetJITFunctionBody(this->m_func);
        pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar16);
        pJVar16 = Func::GetJITFunctionBody(this->m_func);
        uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
        this_02 = Func::GetWorkItem(this->m_func);
        this_03 = JITTimeWorkItem::GetJITTimeInfo(this_02);
        uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
        pJVar16 = Func::GetJITFunctionBody(this->m_func);
        uVar8 = JITTimeFunctionBody::GetFunctionNumber(pJVar16);
        swprintf_s<512ul>((WCHAR (*) [512])local_4b8,L"%s (#%d.%u, #%u)",pcVar17,(ulong)uVar6,
                          (ulong)uVar7,(ulong)uVar8);
        labelCheckEquivalentType = (LabelInstr *)0x0;
        bVar3 = JITTypeHolderBase<void>::operator!=(&local_a0,&labelCheckEquivalentType);
        if (bVar3) {
          local_5b8 = L"direct";
        }
        else {
          bVar3 = IR::PropertySymOpnd::IsPoly(propertySymOpnd);
          local_5b8 = L"indirect";
          if (bVar3) {
            local_5b8 = L"equivalent";
          }
        }
        Output::TraceWithPrefix(ObjTypeSpecPhase,local_4b8,L"Emitted %s type check ",local_5b8);
      }
    }
    pBVar18 = IR::PropertySymOpnd::GetGuardedPropOps(propertySymOpnd);
    if (pBVar18 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Output::Print(L"\n");
    }
    else {
      Output::Print(L" guarding operations:\n    ");
      pBVar18 = IR::PropertySymOpnd::GetGuardedPropOps(propertySymOpnd);
      BVSparse<Memory::JitArenaAllocator>::Dump(pBVar18);
    }
    Output::Flush();
  }
  if (local_539 == false) {
    local_5d8 = labelTypeCheckFailed;
    if (labelSecondChance != (LabelInstr *)0x0) {
      local_5d8 = labelSecondChance;
    }
    local_508 = InsertCompareBranch(this,&typeOpnd_00->super_Opnd,(Opnd *)directCheckType.t,BrNeq_A,
                                    local_5d8,instrChk,false);
    InsertObjectPoison(&pRVar10->super_Opnd,local_508,instrChk,false);
  }
  else {
    branchInstr = (BranchInstr *)IR::LabelInstr::New(Label,func_00,true);
    labelTypeCheckSucceeded =
         (LabelInstr *)
         InsertCompareBranch(this,&typeOpnd_00->super_Opnd,(Opnd *)directCheckType.t,BrNeq_A,
                             (LabelInstr *)branchInstr,instrChk,false);
    InsertObjectPoison(&pRVar10->super_Opnd,(BranchInstr *)labelTypeCheckSucceeded,instrChk,false);
    typeCheckGuardOpnd = (Opnd *)IR::LabelInstr::New(Label,func_00,false);
    InsertBranch(Br,(LabelInstr *)typeCheckGuardOpnd,instrChk);
    IR::Instr::InsertBefore(instrChk,&branchInstr->super_Instr);
    pAStack_4e0 = (AddrOpnd *)0x0;
    bVar3 = Func::IsOOPJIT(this->m_func);
    if (bVar3) {
      pAStack_4e0 = (AddrOpnd *)IR::RegOpnd::New(TyUint64,func_00);
      pRVar10 = IR::Opnd::AsRegOpnd((Opnd *)pAStack_4e0);
      GenerateLeaOfOOPData(this,pRVar10,polyIndexOpnd,0,instrChk);
      pBVar18 = this->addToLiveOnBackEdgeSyms;
      pFVar19 = Func::GetTopFunc(func_00);
      pSVar20 = Func::GetNativeCodeDataSym(pFVar19);
      BVSparse<Memory::JitArenaAllocator>::Set(pBVar18,(pSVar20->super_Sym).m_id);
    }
    else {
      pAStack_4e0 = IR::AddrOpnd::New(polyIndexOpnd,AddrOpndKindDynamicTypeCheckGuard,func_00,true,
                                      (Var)0x0);
    }
    if (monoType.t == (Type)0x0) {
      bVar3 = IR::PropertySymOpnd::HasFixedValue(propertySymOpnd);
      equivalentTypeCheckResultOpnd._4_4_ = HelperCheckIfTypeIsEquivalent;
      if (bVar3) {
        equivalentTypeCheckResultOpnd._4_4_ = HelperCheckIfTypeIsEquivalentForFixedField;
      }
    }
    else {
      bVar3 = IR::PropertySymOpnd::HasFixedValue(propertySymOpnd);
      equivalentTypeCheckResultOpnd._4_4_ = HelperCheckIfPolyTypeIsEquivalent;
      if (bVar3) {
        equivalentTypeCheckResultOpnd._4_4_ = HelperCheckIfPolyTypeIsEquivalentForFixedField;
      }
      LowererMD::LoadHelperArgument(&this->m_lowererMD,instrChk,(Opnd *)monoType.t);
    }
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instrChk,&pAStack_4e0->super_Opnd);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instrChk,&typeOpnd_00->super_Opnd);
    equivalentTypeCheckHelperCallOpnd = (HelperCallOpnd *)IR::RegOpnd::New(TyUint8,func_00);
    equivalentTypeCheckCallInstr =
         (Instr *)IR::HelperCallOpnd::New(equivalentTypeCheckResultOpnd._4_4_,func_00);
    branchInstr_1 =
         (BranchInstr *)
         IR::Instr::New(Call,&equivalentTypeCheckHelperCallOpnd->super_Opnd,
                        (Opnd *)equivalentTypeCheckCallInstr,func_00);
    IR::Instr::InsertBefore(instrChk,(Instr *)branchInstr_1);
    LowererMD::LowerCall(&this->m_lowererMD,&branchInstr_1->super_Instr,0);
    InsertTestBranch(&equivalentTypeCheckHelperCallOpnd->super_Opnd,
                     &equivalentTypeCheckHelperCallOpnd->super_Opnd,BrEq_A,labelTypeCheckFailed,
                     instrChk);
    IR::Instr::InsertBefore(instrChk,(Instr *)typeCheckGuardOpnd);
  }
  if (local_539 == false) {
    local_510 = (nullptr_t)0x0;
    bVar3 = JITTypeHolderBase<void>::operator!=(&local_80,&local_510);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1e51,"(monoType != nullptr)","monoType != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    type.t = (Type)local_80;
    pPVar21 = Sym::AsPropertySym((propertySymOpnd->super_SymOpnd).m_sym);
    PinTypeRef(this,(JITTypeHolder)type.t,type.t,instrChk,pPVar21->m_propertyId);
  }
  return typeOpnd_00;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateCachedTypeCheck(IR::Instr *instrChk, IR::PropertySymOpnd *propertySymOpnd, IR::LabelInstr* labelObjCheckFailed, IR::LabelInstr *labelTypeCheckFailed, IR::LabelInstr *labelSecondChance)
{
    Assert(propertySymOpnd->MayNeedTypeCheckProtection());

    Func* func = instrChk->m_func;
    IR::RegOpnd *regOpnd = propertySymOpnd->CreatePropertyOwnerOpnd(func);
    regOpnd->SetValueType(propertySymOpnd->GetPropertyOwnerValueType());

    if (!regOpnd->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(regOpnd, instrChk, labelObjCheckFailed);
    }

    // Load the current object type into typeOpnd
    IR::RegOpnd* typeOpnd = IR::RegOpnd::New(TyMachReg, func);
    IR::Opnd *sourceType;
    if (regOpnd->m_sym->IsConst() && !regOpnd->m_sym->IsIntConst() && !regOpnd->m_sym->IsFloatConst())
    {
        sourceType = IR::MemRefOpnd::New((BYTE*)regOpnd->m_sym->GetConstAddress() +
            Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func, IR::AddrOpndKindDynamicObjectTypeRef);
    }
    else
    {
        sourceType = IR::IndirOpnd::New(regOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func);
    }
    InsertMove(typeOpnd, sourceType, instrChk);

    // Note: don't attempt equivalent type check if we're doing a final type optimization or if we have a monomorphic
    // cache and no type check bailout. In the latter case, we can wind up doing expensive failed equivalence checks
    // repeatedly and never rejit.
    bool doEquivTypeCheck =
        (instrChk->HasEquivalentTypeCheckBailOut() && (propertySymOpnd->TypeCheckRequired() || propertySymOpnd == instrChk->GetDst())) ||
        (propertySymOpnd->HasEquivalentTypeSet() &&
         !(propertySymOpnd->HasFinalType() && propertySymOpnd->HasInitialType()) &&
         !propertySymOpnd->MustDoMonoCheck() &&
         (propertySymOpnd->IsPoly() || instrChk->HasTypeCheckBailOut()));
    Assert(doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut());

    // Create and initialize the property guard if required. Note that for non-shared monomorphic checks we can refer
    // directly to the (pinned) type and not use a guard.
    Js::PropertyGuard * typeCheckGuard;
    IR::RegOpnd * polyIndexOpnd = nullptr;
    JITTypeHolder monoType = nullptr;
    if (doEquivTypeCheck)
    {
        typeCheckGuard = CreateEquivalentTypeGuardAndLinkToGuardedProperties(propertySymOpnd);
        if (typeCheckGuard->IsPoly())
        {
            Assert(propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func));
            polyIndexOpnd = this->GeneratePolymorphicTypeIndex(typeOpnd, typeCheckGuard, instrChk);
        }
    }
    else
    {
        monoType = propertySymOpnd->MustDoMonoCheck() ? propertySymOpnd->GetMonoGuardType() : propertySymOpnd->GetType();
        typeCheckGuard = this->CreateTypePropertyGuardForGuardedProperties(monoType, propertySymOpnd);
    }

    // Create the opnd we will check against the current type.
    IR::Opnd *expectedTypeOpnd;
    JITTypeHolder directCheckType = nullptr;
    if (typeCheckGuard == nullptr)
    {
        Assert(monoType != nullptr);
        expectedTypeOpnd = IR::AddrOpnd::New(monoType->GetAddr(), IR::AddrOpndKindDynamicType, func, true);
        directCheckType = monoType;
    }
    else
    {
        Assert(Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr]));

        if (this->m_func->IsOOPJIT())
        {
            if (polyIndexOpnd != nullptr)
            {
                IR::RegOpnd * baseOpnd = IR::RegOpnd::New(TyMachPtr, func);
                this->GenerateLeaOfOOPData(baseOpnd, typeCheckGuard, Js::JitPolyEquivalentTypeGuard::GetOffsetOfPolyValues(), instrChk);
                expectedTypeOpnd = IR::IndirOpnd::New(baseOpnd, polyIndexOpnd, m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);
            }
            else
            {
                expectedTypeOpnd = this->GenerateIndirOfOOPData(typeCheckGuard, 0, instrChk);
            }
            this->addToLiveOnBackEdgeSyms->Set(func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            if (polyIndexOpnd != nullptr)
            {
                IR::RegOpnd * baseOpnd = IR::RegOpnd::New(TyMachPtr, func);
                InsertMove(baseOpnd, IR::AddrOpnd::New((Js::Var)typeCheckGuard->AsPolyTypeCheckGuard()->GetAddressOfPolyValues(), IR::AddrOpndKindDynamicTypeCheckGuard, func, true), instrChk);
                expectedTypeOpnd = IR::IndirOpnd::New(baseOpnd, polyIndexOpnd, m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);
            }
            else
            {
                expectedTypeOpnd = IR::MemRefOpnd::New((void*)(typeCheckGuard->GetAddressOfValue()), TyMachPtr, func, IR::AddrOpndKindDynamicGuardValueRef);
            }
        }
    }

    if (PHASE_VERBOSE_TRACE(Js::ObjTypeSpecPhase, this->m_func))
    {
        OUTPUT_VERBOSE_TRACE_FUNC(Js::ObjTypeSpecPhase, this->m_func, _u("Emitted %s type check "),
            directCheckType != nullptr ? _u("direct") : propertySymOpnd->IsPoly() ? _u("equivalent") : _u("indirect"));
#if DBG
        if (propertySymOpnd->GetGuardedPropOps() != nullptr)
        {
            Output::Print(_u(" guarding operations:\n    "));
            propertySymOpnd->GetGuardedPropOps()->Dump();
        }
        else
        {
            Output::Print(_u("\n"));
        }
#else
        Output::Print(_u("\n"));
#endif
        Output::Flush();
    }

    if (doEquivTypeCheck)
    {
        // TODO (ObjTypeSpec): For isolated equivalent type checks it would be good to emit a check if the cache is still valid, and
        // if not go straight to live polymorphic cache.  This way we wouldn't have to bail out and re-JIT, and also wouldn't continue
        // to try the equivalent type cache, miss it and do the slow comparison. This may be as easy as sticking a null on the main
        // type in the equivalent type cache.
        IR::LabelInstr* labelCheckEquivalentType = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        IR::BranchInstr* branchInstr = InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelCheckEquivalentType, instrChk);

        InsertObjectPoison(regOpnd, branchInstr, instrChk, false);

        IR::LabelInstr *labelTypeCheckSucceeded = IR::LabelInstr::New(Js::OpCode::Label, func, false);
        InsertBranch(Js::OpCode::Br, labelTypeCheckSucceeded, instrChk);

        instrChk->InsertBefore(labelCheckEquivalentType);

        IR::Opnd* typeCheckGuardOpnd = nullptr;
        if (this->m_func->IsOOPJIT())
        {
            typeCheckGuardOpnd = IR::RegOpnd::New(TyMachPtr, func);
            this->GenerateLeaOfOOPData(typeCheckGuardOpnd->AsRegOpnd(), typeCheckGuard, 0, instrChk);
            this->addToLiveOnBackEdgeSyms->Set(func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            typeCheckGuardOpnd = IR::AddrOpnd::New((Js::Var)typeCheckGuard, IR::AddrOpndKindDynamicTypeCheckGuard, func, true);
        }

        IR::JnHelperMethod helperMethod;
        if (polyIndexOpnd != nullptr)
        {
            helperMethod = propertySymOpnd->HasFixedValue() ? IR::HelperCheckIfPolyTypeIsEquivalentForFixedField : IR::HelperCheckIfPolyTypeIsEquivalent;

            this->m_lowererMD.LoadHelperArgument(instrChk, polyIndexOpnd);
        }
        else
        {
            helperMethod = propertySymOpnd->HasFixedValue() ? IR::HelperCheckIfTypeIsEquivalentForFixedField : IR::HelperCheckIfTypeIsEquivalent;
        }
        this->m_lowererMD.LoadHelperArgument(instrChk, typeCheckGuardOpnd);
        this->m_lowererMD.LoadHelperArgument(instrChk, typeOpnd);

        IR::RegOpnd* equivalentTypeCheckResultOpnd = IR::RegOpnd::New(TyUint8, func);
        IR::HelperCallOpnd* equivalentTypeCheckHelperCallOpnd = IR::HelperCallOpnd::New(helperMethod, func);
        IR::Instr* equivalentTypeCheckCallInstr = IR::Instr::New(Js::OpCode::Call, equivalentTypeCheckResultOpnd, equivalentTypeCheckHelperCallOpnd, func);
        instrChk->InsertBefore(equivalentTypeCheckCallInstr);
        this->m_lowererMD.LowerCall(equivalentTypeCheckCallInstr, 0);

        InsertTestBranch(equivalentTypeCheckResultOpnd, equivalentTypeCheckResultOpnd, Js::OpCode::BrEq_A, labelTypeCheckFailed, instrChk);

        // TODO (ObjTypeSpec): Consider emitting a shared bailout to which a specific bailout kind is written at runtime. This would allow us to distinguish
        // between non-equivalent type and other cases, such as invalidated guard (due to fixed field overwrite, perhaps) or too much thrashing on the
        // equivalent type cache. We could determine bailout kind based on the value returned by the helper. In the case of cache thrashing we could just
        // turn off the whole optimization for a given function.

        instrChk->InsertBefore(labelTypeCheckSucceeded);
    }
    else
    {
        IR::BranchInstr* branchInstr = InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelSecondChance != nullptr ? labelSecondChance : labelTypeCheckFailed, instrChk);
        InsertObjectPoison(regOpnd, branchInstr, instrChk, false);
    }

    // Don't pin the type for polymorphic operations. The code can successfully execute even if this type is no longer referenced by any objects,
    // as long as there are other objects with types equivalent on the properties referenced by this code. The type is kept alive until entry point
    // installation by the JIT transfer data, and after that by the equivalent type cache, so it will stay alive unless or until it gets evicted
    // from the cache.
    if (!doEquivTypeCheck)
    {
        Assert(monoType != nullptr);
        PinTypeRef(monoType, monoType.t, instrChk, propertySymOpnd->m_sym->AsPropertySym()->m_propertyId);
    }

    return typeOpnd;
}